

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O3

void processContentSpecNode(ContentSpecNode *cSpecNode,bool margin)

{
  long lVar1;
  char *pcVar2;
  
  if (cSpecNode == (ContentSpecNode *)0x0) {
    return;
  }
  if (margin) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ContentType:\t",0xd);
  switch(*(undefined4 *)(cSpecNode + 0x30)) {
  case 0:
    pcVar2 = "Leaf";
    goto LAB_00104f02;
  case 1:
    pcVar2 = "ZeroOrOne";
    goto LAB_00104ed8;
  case 2:
    pcVar2 = "ZeroOrMore";
    goto LAB_00104eb3;
  case 3:
    pcVar2 = "OneOrMore";
    goto LAB_00104ed8;
  case 4:
  case 0x24:
    pcVar2 = "Choice";
    goto LAB_00104dfa;
  case 5:
  case 0x15:
    pcVar2 = "Sequence";
    goto LAB_00104f2c;
  case 6:
    pcVar2 = "Any";
    goto LAB_00104e3d;
  case 7:
    pcVar2 = "Any_Other";
LAB_00104ed8:
    lVar1 = 9;
    break;
  case 8:
    pcVar2 = "Any_NS";
LAB_00104dfa:
    lVar1 = 6;
    break;
  case 9:
    pcVar2 = "All";
LAB_00104e3d:
    lVar1 = 3;
    break;
  case 10:
    pcVar2 = "Loop";
LAB_00104f02:
    lVar1 = 4;
    break;
  default:
    goto switchD_00104db6_caseD_b;
  case 0x14:
    pcVar2 = "Any_NS_Choice";
    goto LAB_00104eed;
  case 0x16:
    pcVar2 = "Any_Lax";
    lVar1 = 7;
    break;
  case 0x17:
    pcVar2 = "Any_Other_Lax";
LAB_00104eed:
    lVar1 = 0xd;
    break;
  case 0x18:
    pcVar2 = "Any_NS_Lax";
LAB_00104eb3:
    lVar1 = 10;
    break;
  case 0x26:
    pcVar2 = "Any_Skip";
LAB_00104f2c:
    lVar1 = 8;
    break;
  case 0x27:
    pcVar2 = "Any_Other_Skip";
    lVar1 = 0xe;
    break;
  case 0x28:
    pcVar2 = "Any_NS_Skip";
LAB_00104f17:
    lVar1 = 0xb;
    break;
  case 0xffffffff:
    pcVar2 = "UnknownType";
    goto LAB_00104f17;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
switchD_00104db6_caseD_b:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return;
}

Assistant:

void processContentSpecNode( const ContentSpecNode* cSpecNode, bool margin )
{
    if( !cSpecNode )
    {
        return;
    }

    if( margin )
    {
        std::cout << "\t";
    }

    std::cout << "ContentType:\t";
    switch( cSpecNode->getType() )
    {
        case ContentSpecNode::Leaf:                std::cout << "Leaf";           break;
        case ContentSpecNode::ZeroOrOne:           std::cout << "ZeroOrOne";      break;
        case ContentSpecNode::ZeroOrMore:          std::cout << "ZeroOrMore";     break;
        case ContentSpecNode::OneOrMore:           std::cout << "OneOrMore";      break;
        case ContentSpecNode::ModelGroupChoice:    
        case ContentSpecNode::Choice:              std::cout << "Choice";         break;
        case ContentSpecNode::ModelGroupSequence:  
        case ContentSpecNode::Sequence:            std::cout << "Sequence";       break;
        case ContentSpecNode::All:                 std::cout << "All";            break;
        case ContentSpecNode::Loop:                std::cout << "Loop";           break;
        case ContentSpecNode::Any:                 std::cout << "Any";            break;
        case ContentSpecNode::Any_Other:           std::cout << "Any_Other";      break;
        case ContentSpecNode::Any_NS:              std::cout << "Any_NS";         break;
        case ContentSpecNode::Any_Lax:             std::cout << "Any_Lax";        break;
        case ContentSpecNode::Any_Other_Lax:       std::cout << "Any_Other_Lax";  break;
        case ContentSpecNode::Any_NS_Lax:          std::cout << "Any_NS_Lax";     break;
        case ContentSpecNode::Any_Skip:            std::cout << "Any_Skip";       break;
        case ContentSpecNode::Any_Other_Skip:      std::cout << "Any_Other_Skip"; break;
        case ContentSpecNode::Any_NS_Skip:         std::cout << "Any_NS_Skip";    break;
        case ContentSpecNode::Any_NS_Choice:       std::cout << "Any_NS_Choice";  break;
        case ContentSpecNode::UnknownType:         std::cout << "UnknownType";    break;
    }
    std::cout << "\n";
}